

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,for_in_statement *s)

{
  gc_heap_ptr<mjs::global_object> *this_00;
  int iVar1;
  statement *psVar2;
  expression *e;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  long *plVar6;
  object *poVar7;
  pointer psVar8;
  value *pvVar9;
  object_ptr o;
  object_ptr o_1;
  value ev;
  value ev_1;
  label_set ls;
  completion c;
  undefined1 local_158 [16];
  vector<mjs::string,_std::allocator<mjs::string>_> local_148;
  completion local_130;
  gc_heap_ptr_untyped local_f0;
  value local_e0;
  expression *local_b8;
  value local_b0;
  _Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  local_88;
  completion local_70;
  
  get_labels((label_set *)&local_88,this,&s->super_statement);
  this_00 = &this->global_;
  pvVar5 = gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
  iVar1 = *(int *)((long)pvVar5 + 0x20);
  completion::completion(&local_70,(value *)&value::undefined,normal);
  iVar4 = (**(code **)((long)(((s->init_)._M_t.
                               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                               .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl)->
                             super_syntax_node)._vptr_syntax_node + 0x18))();
  if (iVar4 == 4) {
    eval((value *)&local_130,this,
         (s->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
         _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(&local_e0,this,(value *)&local_130);
    value::~value((value *)&local_130);
    if ((iVar1 < 2) || (null < local_e0.type_)) {
      plVar6 = (long *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar6 + 0x88))(local_158,plVar6,&local_e0);
      local_b8 = (expression *)
                 (s->init_)._M_t.
                 super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
                 super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl[1].super_syntax_node.
                 _vptr_syntax_node;
      poVar7 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_158);
      object::enumerable_property_names(&local_148,poVar7);
      psVar8 = local_148.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (psVar8 == local_148.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_148);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
          pvVar9 = &local_e0;
LAB_0011d20f:
          value::~value(pvVar9);
          completion::completion(__return_storage_ptr__,&local_70);
          goto LAB_0011d229;
        }
        eval((value *)&local_130,this,local_b8);
        value::value(&local_b0,psVar8);
        put_value(this,(value *)&local_130,&local_b0);
        value::~value(&local_b0);
        value::~value((value *)&local_130);
        eval(&local_130,this,
             (s->s_)._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
        completion::operator=(&local_70,&local_130);
        value::~value(&local_130.result);
        bVar3 = handle_completion(&local_70,(label_set *)&local_88);
        psVar8 = psVar8 + 1;
      } while (!bVar3);
      completion::completion(__return_storage_ptr__,&local_70);
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
    }
    else {
      completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
    }
    pvVar9 = &local_e0;
  }
  else {
    iVar4 = (**(code **)((long)(((s->init_)._M_t.
                                 super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                                 .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl)->
                               super_syntax_node)._vptr_syntax_node + 0x18))();
    if (iVar4 != 1) {
      __assert_fail("s.init().type() == statement_type::variable",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,999,"completion mjs::interpreter::impl::operator()(const for_in_statement &)");
    }
    psVar2 = (s->init_)._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
    local_158._8_8_ = psVar2[1].super_syntax_node._vptr_syntax_node;
    if (*(long *)&psVar2[1].super_syntax_node.extend_.file.
                  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> - local_158._8_8_
        != 0x28) {
      __assert_fail("var_statement.l().size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x3e9,"completion mjs::interpreter::impl::operator()(const for_in_statement &)"
                   );
    }
    e = (((value_type *)local_158._8_8_)->init_)._M_t.
        super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
        super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
        super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    local_158._0_8_ = this;
    if (e == (expression *)0x0) {
      value::value((value *)&local_130,(value *)&value::undefined);
    }
    else {
      eval(&local_e0,this,e);
      get_value((value *)&local_130,this,&local_e0);
    }
    operator()::anon_class_16_2_3fe14ecb::operator()
              ((anon_class_16_2_3fe14ecb *)local_158,(value *)&local_130);
    value::~value((value *)&local_130);
    if (e != (expression *)0x0) {
      value::~value(&local_e0);
    }
    eval((value *)&local_130,this,
         (s->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
         _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(&local_b0,this,(value *)&local_130);
    value::~value((value *)&local_130);
    if ((iVar1 < 2) || (null < local_b0.type_)) {
      plVar6 = (long *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar6 + 0x88))(&local_f0,plVar6,&local_b0);
      poVar7 = (object *)gc_heap_ptr_untyped::get(&local_f0);
      object::enumerable_property_names(&local_148,poVar7);
      psVar8 = local_148.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (psVar8 == local_148.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_148);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_f0);
          pvVar9 = &local_b0;
          goto LAB_0011d20f;
        }
        value::value((value *)&local_130,psVar8);
        operator()::anon_class_16_2_3fe14ecb::operator()
                  ((anon_class_16_2_3fe14ecb *)local_158,(value *)&local_130);
        value::~value((value *)&local_130);
        eval(&local_130,this,
             (s->s_)._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
        completion::operator=(&local_70,&local_130);
        value::~value(&local_130.result);
        bVar3 = handle_completion(&local_70,(label_set *)&local_88);
        psVar8 = psVar8 + 1;
      } while (!bVar3);
      completion::completion(__return_storage_ptr__,&local_70);
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_f0);
    }
    else {
      completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
    }
    pvVar9 = &local_b0;
  }
  value::~value(pvVar9);
LAB_0011d229:
  value::~value(&local_70.result);
  std::
  _Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ::~_Vector_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const for_in_statement& s) {
        const auto ls = get_labels(s);

        // In ES5.1 for (?? in null/undefined) is just a no-op
        auto skip = [ver = global_->language_version()](value_type t) { return ver >= version::es5 && (t == value_type::undefined || t == value_type::null); };

        completion c{};
        if (s.init().type() == statement_type::expression) {
            auto ev = get_value(eval(s.e()));
            if (skip(ev.type())) {
                return completion{};
            }
            auto o = global_->to_object(ev);
            const auto& lhs_expression = static_cast<const expression_statement&>(s.init()).e();
            for (const auto& n: o->enumerable_property_names()) {
                put_value(eval(lhs_expression), value{n});
                c = eval(s.s());
                if (handle_completion(c, ls)) {
                    return c;
                }
            }
        } else {
            assert(s.init().type() == statement_type::variable);
            const auto& var_statement = static_cast<const variable_statement&>(s.init());
            assert(var_statement.l().size() == 1);
            const auto& init = var_statement.l()[0];

            auto assign = [&](const value& val) {
                put_value(value{active_scope_->lookup(init.id())}, val);
            };

            assign(init.init() ? get_value(eval(*init.init())) : value::undefined);

            // Happens after the initial assignment
            auto ev = get_value(eval(s.e()));
            if (skip(ev.type())) {
                return completion{};
            }
            auto o = global_->to_object(ev);

            for (const auto& n: o->enumerable_property_names()) {
                assign(value{n});
                c = eval(s.s());
                if (handle_completion(c, ls)) {
                    return c;
                }
            }
        }
        return c;
    }